

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_target * new_sqlite3_target(sqlite3 *db)

{
  sqlite3_target *psVar1;
  
  psVar1 = (sqlite3_target *)alloc_mem(0x50);
  if (psVar1 == (sqlite3_target *)0x0) {
    psVar1 = (sqlite3_target *)0x0;
  }
  else {
    psVar1->db = db;
    psVar1->insert_sql =
         "INSERT INTO logs ( prival, version, timestamp, hostname, app_name, procid, msgid,  structured_data, message ) VALUES ( $prival, 1, $timestamp, $hostname, $app_name, $procid, $msgid, $structured_data, $message )"
    ;
    psVar1->prepare_func = stumpless_sqlite3_prepare;
    psVar1->prepare_data = psVar1;
    psVar1->insert_stmts[0] = (sqlite3_stmt *)0x0;
    pthread_init_mutex(&psVar1->db_mutex);
  }
  return psVar1;
}

Assistant:

struct sqlite3_target *
new_sqlite3_target( sqlite3 *db ) {
  struct sqlite3_target *target;

  target = alloc_mem( sizeof( *target ) );
  if( !target ) {
    return NULL;
  }

  target->db = db;
  target->insert_sql = STUMPLESS_DEFAULT_SQLITE3_INSERT_SQL;
  target->prepare_func = stumpless_sqlite3_prepare;
  target->prepare_data = target;
  target->insert_stmts[0] = NULL;
  config_init_mutex( &target->db_mutex );

  return target;
}